

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
cs::instance_type::check_define_structured_binding(instance_type *this,iterator it,bool regist)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  int iVar3;
  token_base **pptVar4;
  runtime_error *prVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  allocator local_71;
  size_t local_70;
  domain_manager *local_68;
  instance_type *local_60;
  string local_58;
  iterator it_local;
  
  it_local = it;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  ptVar1 = *pptVar4;
  pp_Var7 = ptVar1[2]._vptr_token_base;
  pp_Var6 = ptVar1[3]._vptr_token_base;
  local_70 = ptVar1[3].line_num;
  pp_Var2 = ptVar1[4]._vptr_token_base;
  local_68 = &(this->super_runtime_type).storage;
  local_60 = this;
  while( true ) {
    if (pp_Var7 == pp_Var2) {
      return;
    }
    local_58._M_dataplus._M_p = (pointer)*pp_Var7;
    pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_58);
    ptVar1 = *pptVar4;
    if (ptVar1 == (token_base *)0x0) break;
    iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar3 == 4) {
      if (regist) {
        domain_manager::add_record(local_68,(string *)(ptVar1 + 3));
      }
    }
    else {
      iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1);
      if (iVar3 != 0xf) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_58,"Wrong grammar for variable definition(8).",&local_71);
        runtime_error::runtime_error(prVar5,&local_58);
        __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      check_define_structured_binding(local_60,(tree_node *)*pp_Var7,regist);
    }
    pp_Var7 = pp_Var7 + 1;
    if (pp_Var7 == pp_Var6) {
      pp_Var7 = *(_func_int ***)(local_70 + 8);
      local_70 = local_70 + 8;
      pp_Var6 = pp_Var7 + 0x40;
    }
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_58,"Wrong grammar for variable definition(7).",&local_71);
  runtime_error::runtime_error(prVar5,&local_58);
  __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void
	instance_type::check_define_structured_binding(tree_type<token_base *>::iterator it, bool regist)
	{
		for (auto &p_it: static_cast<token_parallel *>(it.data())->get_parallel()) {
			token_base *root = p_it.root().data();
			if (root == nullptr)
				throw runtime_error("Wrong grammar for variable definition(7).");
			if (root->get_type() != token_types::id) {
				if (root->get_type() == token_types::parallel)
					check_define_structured_binding(p_it.root(), regist);
				else
					throw runtime_error("Wrong grammar for variable definition(8).");
			}
			else if (regist)
				storage.add_record(static_cast<token_id *>(root)->get_id());
		}
	}